

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_random.cpp
# Opt level: O2

void solve_random(void)

{
  Cache *this;
  clock_t cVar1;
  long lVar2;
  int i;
  long lVar3;
  vector<Video_*,_std::allocator<Video_*>_> v;
  _Vector_base<Video_*,_std::allocator<Video_*>_> local_48;
  
  cVar1 = clock();
  srand((uint)cVar1);
  for (lVar2 = 0; lVar2 < num_caches; lVar2 = lVar2 + 1) {
    this = caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
    std::vector<Video_*,_std::allocator<Video_*>_>::vector
              ((vector<Video_*,_std::allocator<Video_*>_> *)&local_48,&videos);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<Video**,std::vector<Video*,std::allocator<Video*>>>>
              ((__normal_iterator<Video_**,_std::vector<Video_*,_std::allocator<Video_*>_>_>)
               local_48._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Video_**,_std::vector<Video_*,_std::allocator<Video_*>_>_>)
               local_48._M_impl.super__Vector_impl_data._M_finish);
    for (lVar3 = 0; lVar3 < num_videos; lVar3 = lVar3 + 1) {
      if (local_48._M_impl.super__Vector_impl_data._M_start[lVar3]->size <= this->remaining) {
        Cache::add_video(this,local_48._M_impl.super__Vector_impl_data._M_start[lVar3]);
      }
    }
    std::_Vector_base<Video_*,_std::allocator<Video_*>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void solve_random() {
    srand(clock());

    for (int cache_id; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        vector<Video *> v = videos;
        random_shuffle(v.begin(), v.end());
        for (int i = 0; i < num_videos; ++i) {
            Video *video = v[i];
            if (cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }
}